

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O1

void fmt::v10::detail::parse_flags<char>(format_specs<char> *specs,char **it,char *end)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)*it;
  do {
    if (pbVar3 == (byte *)end) {
      return;
    }
    bVar1 = *pbVar3;
    if (bVar1 < 0x2b) {
      if (bVar1 == 0x20) {
        if ((*(ushort *)&specs->field_0x9 & 0x70) != 0x20) {
          uVar2 = *(ushort *)&specs->field_0x9 & 0xff8f | 0x30;
          goto LAB_00112ab9;
        }
      }
      else {
        if (bVar1 != 0x23) {
          return;
        }
        specs->field_0x9 = specs->field_0x9 | 0x80;
      }
    }
    else {
      if (bVar1 == 0x2b) {
        uVar2 = *(ushort *)&specs->field_0x9 & 0xff8f | 0x20;
      }
      else {
        if (bVar1 == 0x30) {
          (specs->fill).data_[0] = '0';
          goto LAB_00112abd;
        }
        if (bVar1 != 0x2d) {
          return;
        }
        uVar2 = (*(ushort *)&specs->field_0x9 & 0xfff0) + 1;
      }
LAB_00112ab9:
      *(ushort *)&specs->field_0x9 = uVar2;
    }
LAB_00112abd:
    pbVar3 = (byte *)(*it + 1);
    *it = (char *)pbVar3;
  } while( true );
}

Assistant:

void parse_flags(format_specs<Char>& specs, const Char*& it, const Char* end) {
  for (; it != end; ++it) {
    switch (*it) {
    case '-':
      specs.align = align::left;
      break;
    case '+':
      specs.sign = sign::plus;
      break;
    case '0':
      specs.fill[0] = '0';
      break;
    case ' ':
      if (specs.sign != sign::plus) specs.sign = sign::space;
      break;
    case '#':
      specs.alt = true;
      break;
    default:
      return;
    }
  }
}